

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Track::Seek(Track *this,longlong time_ns,BlockEntry **pResult)

{
  Cluster **ppCVar1;
  Cluster *pCluster;
  undefined1 auVar2 [16];
  Cluster **ppCVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  longlong lVar6;
  BlockEntry *pBVar7;
  Cluster **ppCVar8;
  Cluster **ppCVar9;
  
  lVar5 = GetFirst(this,pResult);
  if (-1 < lVar5) {
    iVar4 = (*(*pResult)->_vptr_BlockEntry[3])();
    if (iVar4 != 0) {
      pCluster = (*pResult)->m_pCluster;
      iVar4 = (*(*pResult)->_vptr_BlockEntry[2])();
      lVar6 = Block::GetTime((Block *)CONCAT44(extraout_var,iVar4),pCluster);
      if (lVar6 < time_ns) {
        ppCVar9 = this->m_pSegment->m_clusters;
        ppCVar1 = ppCVar9 + pCluster->m_index;
        ppCVar3 = ppCVar1;
        ppCVar9 = ppCVar9 + this->m_pSegment->m_clusterCount;
        while (ppCVar8 = ppCVar3, ppCVar8 < ppCVar9) {
          auVar2._8_8_ = (long)ppCVar9 - (long)ppCVar8 >> 0x3f;
          auVar2._0_8_ = (long)ppCVar9 - (long)ppCVar8 >> 3;
          lVar5 = SUB168(auVar2 / SEXT816(2),0);
          lVar6 = Cluster::GetTime(ppCVar8[lVar5]);
          ppCVar3 = ppCVar8 + lVar5 + 1;
          if (time_ns < lVar6) {
            ppCVar3 = ppCVar8;
            ppCVar9 = ppCVar8 + lVar5;
          }
        }
        while (ppCVar1 < ppCVar8) {
          ppCVar9 = ppCVar8 + -1;
          ppCVar8 = ppCVar8 + -1;
          pBVar7 = Cluster::GetEntry(*ppCVar9,this,-1);
          *pResult = pBVar7;
          if ((pBVar7 != (BlockEntry *)0x0) &&
             (iVar4 = (*pBVar7->_vptr_BlockEntry[3])(pBVar7), iVar4 != 0)) {
            return 0;
          }
        }
        *pResult = &(this->m_eos).super_BlockEntry;
      }
    }
    lVar5 = 0;
  }
  return lVar5;
}

Assistant:

long Track::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not preloaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  while (lo > i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this);

    if ((pResult != 0) && !pResult->EOS())
      return 0;

    // landed on empty cluster (no entries)
  }

  pResult = GetEOS();  // weird
  return 0;
}